

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Array<unsigned_char> * __thiscall
kj::anon_unknown_9::DiskHandle::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,DiskHandle *this,uint64_t offset,
          uint64_t size)

{
  void *pvVar1;
  int *piVar2;
  MmapRange MVar3;
  Fault f;
  
  if (size == 0) {
    __return_storage_ptr__->ptr = (uchar *)0x0;
    __return_storage_ptr__->size_ = 0;
    __return_storage_ptr__->disposer = (ArrayDisposer *)0x0;
  }
  else {
    MVar3 = getMmapRange(offset,size);
    pvVar1 = mmap64((void *)0x0,MVar3.size,3,2,(this->fd).fd,MVar3.offset);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      piVar2 = __errno_location();
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x178,*piVar2,"mmap","");
      kj::_::Debug::Fault::fatal(&f);
    }
    __return_storage_ptr__->ptr = (uchar *)((long)pvVar1 + (offset - MVar3.offset));
    __return_storage_ptr__->size_ = size;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer;
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const {
    if (size == 0) return nullptr;  // zero-length mmap() returns EINVAL, so avoid it
    auto range = getMmapRange(offset, size);
    void* mapping = ::mmap(NULL, range.size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<byte>(reinterpret_cast<byte*>(mapping) + (offset - range.offset),
                       size, mmapDisposer);
  }